

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeAtomTypesSectionParser.cpp
# Opt level: O2

FluctuatingTypeEnum __thiscall
OpenMD::FluctuatingChargeAtomTypesSectionParser::getFluctuatingTypeEnum
          (FluctuatingChargeAtomTypesSectionParser *this,string *str)

{
  _Rb_tree_color _Var1;
  iterator iVar2;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum>_>_>
          ::find(&(this->stringToEnumMap_)._M_t,str);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header) {
    _Var1 = 4;
  }
  else {
    _Var1 = iVar2._M_node[2]._M_color;
  }
  return _Var1;
}

Assistant:

FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum
      FluctuatingChargeAtomTypesSectionParser::getFluctuatingTypeEnum(
          const std::string& str) {
    std::map<std::string, FluctuatingTypeEnum>::iterator i;
    i = stringToEnumMap_.find(str);

    return i == stringToEnumMap_.end() ? fqtUnknown : i->second;
  }